

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppu_widget.cpp
# Opt level: O2

void __thiscall nesvis::PpuWidget::draw(PpuWidget *this)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  ushort uVar6;
  bool bVar7;
  PpuRegisters *pPVar8;
  
  ImGui::Begin("Nes ppu",(bool *)0x0,0);
  pPVar8 = n_e_s::nes::Nes::ppu_registers(this->nes_);
  bVar1 = (pPVar8->ctrl).value_;
  bVar2 = (pPVar8->mask).super_Register<unsigned_char>.value_;
  bVar3 = (pPVar8->status).value_;
  bVar4 = pPVar8->oamaddr;
  bVar5 = pPVar8->fine_x_scroll;
  uVar6 = (pPVar8->vram_addr).super_Register<unsigned_short>.value_;
  ImGui::Text("%s: %02hhX","ctrl",(ulong)bVar1);
  bVar7 = ImGui::IsItemHovered(0);
  if (bVar7) {
    ImGui::BeginTooltip();
    ImGui::Text("Ctrl: 0x2000");
    ImGui::Text("Nametable address: %d:%d",(ulong)(bVar1 & 1),(ulong)(bVar1 >> 1 & 1));
    ImGui::Text("Vram increment: %d",(ulong)(bVar1 >> 2 & 1));
    ImGui::Text("Sprite pattern table address: %d",(ulong)(bVar1 >> 3 & 1));
    ImGui::Text("Background pattern table address: %d",(ulong)(bVar1 >> 4 & 1));
    ImGui::Text("Sprite size: %d",(ulong)(bVar1 >> 5 & 1));
    ImGui::Text("Ppu master/slave select: %d",(ulong)(bVar1 >> 6 & 1));
    ImGui::Text("Generate NMI: %d",(ulong)(bVar1 >> 7));
    ImGui::EndTooltip();
  }
  ImGui::Text("%s: %02hhX","mask",(ulong)bVar2);
  bVar7 = ImGui::IsItemHovered(0);
  if (bVar7) {
    ImGui::BeginTooltip();
    ImGui::Text("Mask: 0x2001");
    ImGui::Text("Greyscale: %d",(ulong)(bVar2 & 1));
    ImGui::Text("Show bkg left: %d",(ulong)(bVar2 >> 1 & 1));
    ImGui::Text("Show sprites left: %d",(ulong)(bVar2 >> 2 & 1));
    ImGui::Text("Show bkg: %d",(ulong)(bVar2 >> 3 & 1));
    ImGui::Text("Show sprites: %d",(ulong)(bVar2 >> 4 & 1));
    ImGui::EndTooltip();
  }
  ImGui::Text("%s: %02hhX","status",(ulong)bVar3);
  ImGui::Text("%s: %02hhX","oamaddr",(ulong)bVar4);
  ImGui::Text("%s: %02hhX","scroll",(ulong)bVar5);
  ImGui::Text("%s: %04hX","vram_addr",(ulong)uVar6);
  bVar7 = ImGui::CollapsingHeader("Pattern tables",0);
  if (bVar7) {
    draw_patterntables(this);
  }
  bVar7 = ImGui::CollapsingHeader("Nametables",0);
  if (bVar7) {
    draw_nametables(this);
  }
  bVar7 = ImGui::CollapsingHeader("Sprites",0);
  if (bVar7) {
    draw_sprites(this);
  }
  bVar7 = ImGui::CollapsingHeader("Palettes",0);
  if (bVar7) {
    draw_palettes(this);
  }
  ImGui::End();
  return;
}

Assistant:

void PpuWidget::draw() {
    ImGui::Begin("Nes ppu");

    const auto reg = nes_->ppu_registers();

    ImGui::Text("%s: %02hhX", "ctrl", reg.ctrl.value());
    if (ImGui::IsItemHovered()) {
        ImGui::BeginTooltip();
        ImGui::Text("Ctrl: 0x2000");
        ImGui::Text("Nametable address: %d:%d",
                reg.ctrl.is_set(0),
                reg.ctrl.is_set(1));
        ImGui::Text("Vram increment: %d", reg.ctrl.is_set(2));
        ImGui::Text("Sprite pattern table address: %d", reg.ctrl.is_set(3));
        ImGui::Text("Background pattern table address: %d", reg.ctrl.is_set(4));
        ImGui::Text("Sprite size: %d", reg.ctrl.is_set(5));
        ImGui::Text("Ppu master/slave select: %d", reg.ctrl.is_set(6));
        ImGui::Text("Generate NMI: %d", reg.ctrl.is_set(7));
        ImGui::EndTooltip();
    }

    ImGui::Text("%s: %02hhX", "mask", reg.mask.value());
    if (ImGui::IsItemHovered()) {
        ImGui::BeginTooltip();
        ImGui::Text("Mask: 0x2001");
        ImGui::Text("Greyscale: %d", reg.mask.is_set(0));
        ImGui::Text("Show bkg left: %d", reg.mask.is_set(1));
        ImGui::Text("Show sprites left: %d", reg.mask.is_set(2));
        ImGui::Text("Show bkg: %d", reg.mask.is_set(3));
        ImGui::Text("Show sprites: %d", reg.mask.is_set(4));
        ImGui::EndTooltip();
    }

    ImGui::Text("%s: %02hhX", "status", reg.status.value());

    ImGui::Text("%s: %02hhX", "oamaddr", reg.oamaddr);

    ImGui::Text("%s: %02hhX", "scroll", reg.fine_x_scroll);

    ImGui::Text("%s: %04hX", "vram_addr", reg.vram_addr.value());

    if (ImGui::CollapsingHeader("Pattern tables")) {
        draw_patterntables();
    }
    if (ImGui::CollapsingHeader("Nametables")) {
        draw_nametables();
    }
    if (ImGui::CollapsingHeader("Sprites")) {
        draw_sprites();
    }
    if (ImGui::CollapsingHeader("Palettes")) {
        draw_palettes();
    }

    ImGui::End(); // window
}